

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelativeWorldCoordinates.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RelativeWorldCoordinates::Encode
          (RelativeWorldCoordinates *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  RelativeWorldCoordinates *this_local;
  
  pKVar1 = KDataStream::operator<<(stream,this->m_ui16RefPnt);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DelX).super_DataTypeBase);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,&(this->m_DelY).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar1,&(this->m_DelZ).super_DataTypeBase);
  return;
}

Assistant:

void RelativeWorldCoordinates::Encode( KDataStream & stream ) const
{
    stream << m_ui16RefPnt
           << KDIS_STREAM m_DelX
           << KDIS_STREAM m_DelY
           << KDIS_STREAM m_DelZ;
}